

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O2

bool __thiscall
re2::EmptyStringWalker::PostVisit
          (EmptyStringWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,
          int nchild_args)

{
  bool *pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = false;
  switch(re->op_) {
  case '\x05':
    uVar4 = 0;
    uVar5 = (ulong)(uint)nchild_args;
    if (nchild_args < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        return (long)nchild_args <= (long)uVar4;
      }
      pbVar1 = child_args + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pbVar1 != false);
    return false;
  case '\x06':
    uVar4 = 0;
    uVar5 = (ulong)(uint)nchild_args;
    if (nchild_args < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        return (long)uVar4 < (long)nchild_args;
      }
      pbVar1 = child_args + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pbVar1 == false);
  case '\x02':
  case '\a':
  case '\t':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    bVar2 = true;
    break;
  case '\b':
  case '\v':
    return *child_args;
  case '\n':
    bVar2 = true;
    if (*child_args == false) {
      iVar3 = Regexp::min(re);
      return iVar3 == 0;
    }
  }
  return bVar2;
}

Assistant:

RegexpOp op() { return static_cast<RegexpOp>(op_); }